

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnector.cpp
# Opt level: O2

bool __thiscall
hwnet::TCPConnector::ConnectWithTimeout
          (TCPConnector *this,ConnectCallback *connectFn,size_t timeout,ErrorCallback *errorFn)

{
  bool bVar1;
  __shared_ptr<hwnet::TCPConnector,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  shared_ptr<hwnet::TCPConnector> self;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  bVar1 = Connect(this,connectFn,errorFn);
  if (timeout != 0 && bVar1) {
    std::__shared_ptr<hwnet::TCPConnector,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::TCPConnector,void>
              (local_48,(__weak_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2> *)
                        &this->super_enable_shared_from_this<hwnet::TCPConnector>);
    util::TimerRoutine::
    addTimerOnce<void(&)(std::shared_ptr<hwnet::util::Timer>const&,std::shared_ptr<hwnet::TCPConnector>),std::shared_ptr<hwnet::TCPConnector>&>
              ((TimerRoutine *)
               &self.super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,(milliseconds)&this->poller_->timerRoutine,
               (_func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPConnector> *)
               timeout,(shared_ptr<hwnet::TCPConnector> *)connectTimeout);
    std::__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->connectTimer).
                super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>,
               (__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)
               &self.super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&self);
  }
  return bVar1;
}

Assistant:

bool TCPConnector::ConnectWithTimeout(const ConnectCallback &connectFn,size_t timeout,const ErrorCallback &errorFn) {
	bool ret = Connect(connectFn,errorFn);
	if(ret && timeout > 0) {
		auto self = shared_from_this();
		this->connectTimer = poller_->addTimerOnce(timeout,TCPConnector::connectTimeout,self);
	}
	return ret;
}